

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O1

int cvQuadEwtSet(CVodeMem cv_mem,N_Vector qcur,N_Vector weightQ)

{
  double dVar1;
  
  if (cv_mem->cv_itolQ == 2) {
    N_VAbs(qcur,cv_mem->cv_tempvQ);
    N_VLinearSum(cv_mem->cv_reltolQ,cv_mem->cv_tempvQ,cv_mem->cv_VabstolQ,cv_mem->cv_tempvQ);
  }
  else {
    if (cv_mem->cv_itolQ != 1) {
      return 0;
    }
    N_VAbs(qcur,cv_mem->cv_tempvQ);
    N_VScale(cv_mem->cv_reltolQ,cv_mem->cv_tempvQ,cv_mem->cv_tempvQ);
    N_VAddConst(cv_mem->cv_SabstolQ,cv_mem->cv_tempvQ,cv_mem->cv_tempvQ);
  }
  if ((cv_mem->cv_atolQmin0 != 0) && (dVar1 = (double)N_VMin(cv_mem->cv_tempvQ), dVar1 <= 0.0)) {
    return -1;
  }
  N_VInv(cv_mem->cv_tempvQ,weightQ);
  return 0;
}

Assistant:

static int cvQuadEwtSet(CVodeMem cv_mem, N_Vector qcur, N_Vector weightQ)
{
  int flag = 0;

  switch (cv_mem->cv_itolQ)
  {
  case CV_SS: flag = cvQuadEwtSetSS(cv_mem, qcur, weightQ); break;
  case CV_SV: flag = cvQuadEwtSetSV(cv_mem, qcur, weightQ); break;
  }

  return (flag);
}